

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ExpressionStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,ExpressionSyntax *args_2,
          Token *args_3)

{
  Token semi;
  ExpressionStatementSyntax *this_00;
  Token *args_local_3;
  ExpressionSyntax *args_local_2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local_1;
  NamedLabelSyntax **args_local;
  BumpAllocator *this_local;
  
  this_00 = (ExpressionStatementSyntax *)allocate(this,0x60,8);
  semi.kind = args_3->kind;
  semi._2_1_ = args_3->field_0x2;
  semi.numFlags.raw = (args_3->numFlags).raw;
  semi.rawLen = args_3->rawLen;
  semi.info = args_3->info;
  slang::syntax::ExpressionStatementSyntax::ExpressionStatementSyntax
            (this_00,*args,args_1,args_2,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }